

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_limit_aspect_ratio(REF_DBL *metric,REF_GRID ref_grid,REF_DBL aspect_ratio)

{
  uint uVar1;
  REF_NODE pRVar2;
  undefined8 uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  REF_DBL diag_system [12];
  double dVar8;
  undefined8 uVar9;
  double local_98;
  double local_90;
  double local_88;
  
  dVar8 = (double)(~-(ulong)(0.9999 < aspect_ratio) & 0x426d1a94a2000000 |
                  (ulong)(aspect_ratio * aspect_ratio) & -(ulong)(0.9999 < aspect_ratio));
  uVar3 = 0;
  pRVar2 = ref_grid->node;
  if (ref_grid->twod == 0) {
    if (0 < pRVar2->max) {
      dVar5 = dVar8 * 1e+20;
      if (dVar5 <= -dVar5) {
        dVar5 = -dVar5;
      }
      uVar9 = 0;
      lVar4 = 0;
      do {
        if (-1 < pRVar2->global[lVar4]) {
          uVar1 = ref_matrix_diag_m(metric,&local_98);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x7f8,"ref_metric_limit_aspect_ratio",(ulong)uVar1,"eigen decomp",dVar8,uVar3,
                   dVar5,uVar9);
            return uVar1;
          }
          dVar6 = local_90;
          if (local_90 <= local_98) {
            dVar6 = local_98;
          }
          dVar7 = local_88;
          if (local_88 <= dVar6) {
            dVar7 = dVar6;
          }
          dVar6 = dVar7;
          if (dVar7 <= -dVar7) {
            dVar6 = -dVar7;
          }
          if (dVar5 <= dVar6) {
            uVar3 = 0x7fc;
            goto LAB_001be3fb;
          }
          dVar7 = dVar7 / dVar8;
          if (local_98 <= dVar7) {
            local_98 = dVar7;
          }
          if (local_90 <= dVar7) {
            local_90 = dVar7;
          }
          if (local_88 <= dVar7) {
            local_88 = dVar7;
          }
          uVar1 = ref_matrix_form_m(&local_98,metric);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x804,"ref_metric_limit_aspect_ratio",(ulong)uVar1,"reform m",dVar8,uVar3,dVar5,
                   uVar9);
            return uVar1;
          }
        }
        lVar4 = lVar4 + 1;
        pRVar2 = ref_grid->node;
        metric = metric + 6;
      } while (lVar4 < pRVar2->max);
    }
  }
  else if (0 < pRVar2->max) {
    dVar5 = dVar8 * 1e+20;
    if (dVar5 <= -dVar5) {
      dVar5 = -dVar5;
    }
    uVar9 = 0;
    lVar4 = 0;
    do {
      if (-1 < pRVar2->global[lVar4]) {
        uVar1 = ref_matrix_diag_m(metric,&local_98);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x7e9,"ref_metric_limit_aspect_ratio",(ulong)uVar1,"eigen decomp",dVar8,uVar3,dVar5
                 ,uVar9);
          return uVar1;
        }
        uVar1 = ref_matrix_descending_eig_twod(&local_98);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x7ea,"ref_metric_limit_aspect_ratio",(ulong)uVar1,"2D eig sort",dVar8,uVar3,dVar5,
                 uVar9);
          return uVar1;
        }
        dVar6 = local_90;
        if (local_90 <= local_98) {
          dVar6 = local_98;
        }
        dVar7 = dVar6;
        if (dVar6 <= -dVar6) {
          dVar7 = -dVar6;
        }
        if (dVar5 <= dVar7) {
          uVar3 = 0x7ed;
LAB_001be3fb:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar3,"ref_metric_limit_aspect_ratio","AR div zero");
          return 1;
        }
        dVar6 = dVar6 / dVar8;
        if (local_98 <= dVar6) {
          local_98 = dVar6;
        }
        if (local_90 <= dVar6) {
          local_90 = dVar6;
        }
        uVar1 = ref_matrix_form_m(&local_98,metric);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x7f3,"ref_metric_limit_aspect_ratio",(ulong)uVar1,"reform m");
          return uVar1;
        }
        uVar1 = ref_matrix_twod_m(metric);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x7f4,"ref_metric_limit_aspect_ratio",(ulong)uVar1,"enforce 2D m for roundoff");
          return uVar1;
        }
      }
      lVar4 = lVar4 + 1;
      pRVar2 = ref_grid->node;
      metric = metric + 6;
    } while (lVar4 < pRVar2->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_limit_aspect_ratio(REF_DBL *metric,
                                                 REF_GRID ref_grid,
                                                 REF_DBL aspect_ratio) {
  REF_DBL diag_system[12];
  REF_DBL max_eig, limit_eig;
  REF_INT node;
  REF_DBL aspect_ratio2;
  if (aspect_ratio > 0.9999) {
    aspect_ratio2 = aspect_ratio * aspect_ratio;
  } else {
    aspect_ratio2 = 1.0e6 * 1.0e6;
  }
  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
      RSS(ref_matrix_descending_eig_twod(diag_system), "2D eig sort");
      max_eig = ref_matrix_eig(diag_system, 0);
      max_eig = MAX(ref_matrix_eig(diag_system, 1), max_eig);
      RAS(ref_math_divisible(max_eig, aspect_ratio2), "AR div zero");
      limit_eig = max_eig / aspect_ratio2;
      ref_matrix_eig(diag_system, 0) =
          MAX(ref_matrix_eig(diag_system, 0), limit_eig);
      ref_matrix_eig(diag_system, 1) =
          MAX(ref_matrix_eig(diag_system, 1), limit_eig);
      RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
      RSS(ref_matrix_twod_m(&(metric[6 * node])), "enforce 2D m for roundoff");
    }
  } else {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
      max_eig = ref_matrix_eig(diag_system, 0);
      max_eig = MAX(ref_matrix_eig(diag_system, 1), max_eig);
      max_eig = MAX(ref_matrix_eig(diag_system, 2), max_eig);
      RAS(ref_math_divisible(max_eig, aspect_ratio2), "AR div zero");
      limit_eig = max_eig / aspect_ratio2;
      ref_matrix_eig(diag_system, 0) =
          MAX(ref_matrix_eig(diag_system, 0), limit_eig);
      ref_matrix_eig(diag_system, 1) =
          MAX(ref_matrix_eig(diag_system, 1), limit_eig);
      ref_matrix_eig(diag_system, 2) =
          MAX(ref_matrix_eig(diag_system, 2), limit_eig);
      RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
    }
  }
  return REF_SUCCESS;
}